

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_3::anon_unknown_0::runCoreChecks(char *filename,bool reduceMemory,bool reduceTime)

{
  ulong uVar1;
  undefined8 uVar2;
  bool reduceTime_00;
  bool reduceMemory_00;
  byte bVar3;
  exr_result_t eVar4;
  byte bVar5;
  byte in_DL;
  byte in_SIL;
  exr_context_initializer_t cinit;
  exr_context_t f;
  bool hadfail;
  exr_result_t rv;
  undefined1 local_90 [6];
  code *f_00;
  exr_context_initializer_t *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  bool local_1;
  
  bVar5 = in_SIL & 1;
  bVar3 = in_DL & 1;
  uVar6 = 0;
  memset(local_90,0,0x68);
  _local_90 = 0x68;
  f_00 = core_error_handler_cb;
  eVar4 = exr_start_read((exr_context_t *)
                         CONCAT17(bVar5,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffffec,
                                                                in_stack_ffffffffffffffe8))),
                         (char *)CONCAT17(uVar6,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                        );
  uVar2 = _local_90;
  if (eVar4 == 0) {
    uVar1 = (ulong)_local_90 >> 0x38;
    reduceMemory_00 = SUB81(uVar1,0);
    reduceTime_00 = SUB81((ulong)uVar2 >> 0x30,0);
    _local_90 = uVar2;
    bVar3 = checkCoreFile((exr_context_t)f_00,reduceMemory_00,reduceTime_00);
    exr_finish((exr_context_t *)f_00);
    local_1 = (bool)(bVar3 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
runCoreChecks (const char* filename, bool reduceMemory, bool reduceTime)
{
    exr_result_t              rv;
    bool                      hadfail = false;
    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

    cinit.error_handler_fn = &core_error_handler_cb;

    if (reduceMemory || reduceTime)
    {
        /* could use set_default functions for this, but those just
         * initialize the context, doing it in the initializer is mt
         * safe...
         * exr_set_default_maximum_image_size (2048, 2048);
         * exr_set_default_maximum_tile_size (512, 512);
         */
        cinit.max_image_width  = 2048;
        cinit.max_image_height = 2048;
        cinit.max_tile_width   = 512;
        cinit.max_tile_height  = 512;
    }

    rv = exr_start_read (&f, filename, &cinit);
    if (rv != EXR_ERR_SUCCESS) return true;

    hadfail = checkCoreFile (f, reduceMemory, reduceTime);

    exr_finish (&f);

    return hadfail;
}